

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O3

int computeRevSOffset(vector<char,_std::allocator<char>_> *cigar)

{
  int iVar1;
  int iVar2;
  int iVar3;
  vector<char,_std::allocator<char>_> t;
  vector<char,_std::allocator<char>_> local_20;
  
  std::vector<char,_std::allocator<char>_>::vector(&local_20,cigar);
  if (local_20.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_20.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    iVar3 = 0;
  }
  else {
    iVar1 = (int)local_20.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    iVar2 = 0;
    do {
      iVar3 = iVar2;
      if (local_20.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish[-1] != 'S') break;
      local_20.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_20.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      iVar2 = iVar2 + 1;
      iVar3 = iVar1 - (int)local_20.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start;
    } while (local_20.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             local_20.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  if (local_20.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar3;
}

Assistant:

int computeRevSOffset(const std::vector<char>& cigar){
    std::vector<char> t = cigar;
    int offset = 0;
    for (std::vector<char>::reverse_iterator it = t.rbegin(); it != t.rend(); ++it){
        if (*it == 'S'){
            offset++;
        } else break;
    }
    return offset;
}